

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

uint64_t read_address(dwarf_buf *buf,int addrsize)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  
  switch(addrsize) {
  case 1:
    bVar1 = read_byte(buf);
    uVar4 = (uint64_t)bVar1;
    break;
  case 2:
    uVar2 = read_uint16(buf);
    uVar4 = (uint64_t)uVar2;
    break;
  default:
    uVar4 = 0;
    dwarf_buf_error(buf,"unrecognized address size",0);
    break;
  case 4:
    uVar3 = read_uint32(buf);
    uVar4 = (uint64_t)uVar3;
    break;
  case 8:
    uVar4 = read_uint64(buf);
    return uVar4;
  }
  return uVar4;
}

Assistant:

static uint64_t
read_address (struct dwarf_buf *buf, int addrsize)
{
  switch (addrsize)
    {
    case 1:
      return read_byte (buf);
    case 2:
      return read_uint16 (buf);
    case 4:
      return read_uint32 (buf);
    case 8:
      return read_uint64 (buf);
    default:
      dwarf_buf_error (buf, "unrecognized address size", 0);
      return 0;
    }
}